

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_ldi_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,int32_t s10)

{
  fpr_t *pfVar1;
  long lVar2;
  
  if (df < 4) {
    pfVar1 = (env->active_fpu).fpr + wd;
    switch(df) {
    case 0:
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        *(char *)((long)pfVar1 + lVar2) = (char)s10;
      }
      break;
    case 1:
      for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
        *(short *)((long)pfVar1 + lVar2 * 2) = (short)s10;
      }
      break;
    case 2:
      for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
        pfVar1->fs[lVar2] = s10;
      }
      break;
    case 3:
      pfVar1->fd = (long)s10;
      *(long *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = (long)s10;
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                ,0x118b,"void helper_msa_ldi_df_mips(CPUMIPSState *, uint32_t, uint32_t, int32_t)");
}

Assistant:

void helper_msa_ldi_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                       int32_t s10)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    uint32_t i;

    switch (df) {
    case DF_BYTE:
        for (i = 0; i < DF_ELEMENTS(DF_BYTE); i++) {
            pwd->b[i] = (int8_t)s10;
        }
        break;
    case DF_HALF:
        for (i = 0; i < DF_ELEMENTS(DF_HALF); i++) {
            pwd->h[i] = (int16_t)s10;
        }
        break;
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            pwd->w[i] = (int32_t)s10;
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            pwd->d[i] = (int64_t)s10;
        }
       break;
    default:
        assert(0);
    }
}